

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

bool __thiscall FakeTokenCommandRunner::AcquireToken(FakeTokenCommandRunner *this)

{
  _Bit_type *p_Var1;
  bool bVar2;
  iterator __position;
  
  p_Var1 = (this->acquire_token_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if (((long)(this->acquire_token_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) * 8 +
      (ulong)(this->acquire_token_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0) {
    bVar2 = false;
    testing::Test::Check
              (g_current_test,false,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xfc5,"\"unexpected call to CommandRunner::AcquireToken()\"");
  }
  else {
    bVar2 = (bool)((byte)*p_Var1 & 1);
    __position.super__Bit_iterator_base._8_8_ = 0;
    __position.super__Bit_iterator_base._M_p = p_Var1;
    std::vector<bool,_std::allocator<bool>_>::_M_erase(&this->acquire_token_,__position);
  }
  return bVar2;
}

Assistant:

TEST_F(BuildTest, MultiOutIn) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"build in1 otherfile: touch in\n"
"build out: touch in | in1\n"));

  fs_.Create("in", "");
  fs_.Tick();
  fs_.Create("in1", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
}